

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

int Cba_StrCmpInt(char *p1,char *p2,int i)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  char cVar9;
  
  cVar1 = p1[i];
  if ((((byte)(cVar1 - 0x3aU) < 0xf6) && (cVar9 = p2[i], (byte)(cVar9 - 0x3aU) < 0xf6)) ||
     (((i < 1 || ((byte)(p1[(ulong)(uint)i - 1] - 0x3aU) < 0xf6)) &&
      (cVar9 = p2[i], (byte)(cVar9 - 0x3aU) < 0xf6 || (byte)(cVar1 - 0x3aU) < 0xf6)))) {
    iVar2 = -1;
    if ((cVar9 <= cVar1) && (iVar2 = 1, cVar1 <= cVar9)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaNtk.c"
                    ,0x19f,"int Cba_StrCmpInt(char *, char *, int)");
    }
  }
  else {
    uVar7 = i >> 0x1f & i;
    uVar3 = i;
    do {
      i = i - 1;
      uVar8 = uVar7;
      uVar4 = uVar7 - 1;
      if ((int)uVar3 < 1) break;
      uVar4 = uVar3 - 1;
      uVar8 = uVar3;
      uVar3 = uVar4;
    } while (0xf5 < (byte)(p1[(uint)i] - 0x3aU));
    if ((byte)(p1[(int)uVar8] - 0x3aU) < 0xf6) {
      __assert_fail("Cba_CharIsDigit(p1[i])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaNtk.c"
                    ,0x18a,"int Cba_StrCmpInt(char *, char *, int)");
    }
    if ((byte)(p2[(int)uVar8] - 0x3aU) < 0xf6) {
      __assert_fail("Cba_CharIsDigit(p2[i])",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaNtk.c"
                    ,0x18b,"int Cba_StrCmpInt(char *, char *, int)");
    }
    if (uVar8 != 0) {
      if (0xf5 < (byte)(p1[(int)uVar4] - 0x3aU)) {
        __assert_fail("i == 0 || !Cba_CharIsDigit(p1[i-1])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaNtk.c"
                      ,0x18d,"int Cba_StrCmpInt(char *, char *, int)");
      }
      if (0xf5 < (byte)(p2[(int)uVar4] - 0x3aU)) {
        __assert_fail("i == 0 || !Cba_CharIsDigit(p2[i-1])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaNtk.c"
                      ,0x18e,"int Cba_StrCmpInt(char *, char *, int)");
      }
    }
    iVar5 = atoi(p1 + (int)uVar8);
    iVar6 = atoi(p2 + (int)uVar8);
    iVar2 = -1;
    if ((iVar6 <= iVar5) && (iVar2 = 1, iVar5 <= iVar6)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/cba/cbaNtk.c"
                    ,0x196,"int Cba_StrCmpInt(char *, char *, int)");
    }
  }
  return iVar2;
}

Assistant:

int Cba_StrCmpInt( char * p1, char * p2, int i )
{
    // check if one of the mismatching chars is a digit
    if ( Cba_CharIsDigit(p1[i]) || Cba_CharIsDigit(p2[i]) )
    {
        // if previous (equal) char was a digit or if this is first digit on both sides, scroll back
        if ( (i > 0 && Cba_CharIsDigit(p1[i-1])) || (Cba_CharIsDigit(p1[i]) && Cba_CharIsDigit(p2[i])) )
        {
            int Num1, Num2;
            // find the first digit
            for ( --i; i >= 0; i-- )
                if ( !Cba_CharIsDigit(p1[i]) )
                    break;
            i++;
            // current char is digit
            assert( Cba_CharIsDigit(p1[i]) );
            assert( Cba_CharIsDigit(p2[i]) );
            // previous char does not exist or is not a digit
            assert( i == 0 || !Cba_CharIsDigit(p1[i-1]) );
            assert( i == 0 || !Cba_CharIsDigit(p2[i-1]) );
            // compare numbers
            Num1 = atoi( p1 + i );
            Num2 = atoi( p2 + i );
            if ( Num1 < Num2 )
                return -1;
            if ( Num1 > Num2 ) 
                return 1;
            assert( 0 );
            return 0;
        }
    }
    // compare as usual
    if ( p1[i] < p2[i] )
        return -1;
    if ( p1[i] > p2[i] )
        return 1;
    assert( 0 );
    return 0;
}